

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_uvnum(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *pAVar1;
  bool bVar2;
  int iVar3;
  int upper_00;
  AREA_DATA_conflict *pAVar4;
  long in_RDI;
  int iupper;
  int ilower;
  char upper [4608];
  AREA_DATA_conflict *pArea;
  undefined4 in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedcc;
  undefined4 in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd4;
  int lower;
  char in_stack_ffffffffffffedd8;
  undefined7 in_stack_ffffffffffffedd9;
  char *in_stack_ffffffffffffede0;
  bool local_1;
  
  pAVar1 = *(AREA_DATA_conflict **)(*(long *)(in_RDI + 0x80) + 0x6c60);
  one_argument((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
               (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  bVar2 = is_number((char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  if ((bVar2) && (in_stack_ffffffffffffedd8 != '\0')) {
    iVar3 = (int)pAVar1->min_vnum;
    lower = iVar3;
    upper_00 = atoi(&stack0xffffffffffffedd8);
    if (upper_00 < iVar3) {
      send_to_char(in_stack_ffffffffffffede0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
      local_1 = false;
    }
    else {
      bVar2 = check_range(lower,upper_00);
      if (bVar2) {
        pAVar4 = get_vnum_area(upper_00);
        if ((pAVar4 == (AREA_DATA_conflict *)0x0) ||
           (pAVar4 = get_vnum_area(upper_00), pAVar4 == pAVar1)) {
          pAVar1->max_vnum = (short)upper_00;
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
          local_1 = true;
        }
        else {
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
          local_1 = false;
        }
      }
      else {
        send_to_char(in_stack_ffffffffffffede0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
        local_1 = false;
      }
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffede0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool aedit_uvnum(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	char upper[MAX_STRING_LENGTH];
	int ilower;
	int iupper;

	EDIT_AREA(ch, pArea);

	one_argument(argument, upper);

	if (!is_number(upper) || upper[0] == '\0')
	{
		send_to_char("Syntax:  max_vnum [#xupper]\n\r", ch);
		return false;
	}

	if ((ilower = pArea->min_vnum) > (iupper = atoi(upper)))
	{
		send_to_char("AEdit:  Upper must be larger then lower.\n\r", ch);
		return false;
	}

	if (!check_range(ilower, iupper))
	{
		send_to_char("AEdit:  Range must include only this area.\n\r", ch);
		return false;
	}

	if (get_vnum_area(iupper) && get_vnum_area(iupper) != pArea)
	{
		send_to_char("AEdit:  Upper vnum already assigned.\n\r", ch);
		return false;
	}

	pArea->max_vnum = iupper;
	send_to_char("Upper vnum set.\n\r", ch);

	return true;
}